

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * build_gnu_sparse_name(char *dest,char *src)

{
  size_t sVar1;
  char *local_28;
  char *p;
  char *src_local;
  char *dest_local;
  
  if ((src == (char *)0x0) || (*src == '\0')) {
    strcpy(dest,"GNUSparseFile/blank");
  }
  else {
    sVar1 = strlen(src);
    local_28 = src + sVar1;
    while( true ) {
      for (; (src < local_28 && (local_28[-1] == '/')); local_28 = local_28 + -1) {
      }
      if ((local_28 <= src + 1) || ((local_28[-1] != '.' || (local_28[-2] != '/')))) break;
      local_28 = local_28 + -1;
    }
    build_ustar_entry_name(dest,src,(long)local_28 - (long)src,"GNUSparseFile.0");
  }
  return dest;
}

Assistant:

static char *
build_gnu_sparse_name(char *dest, const char *src)
{
	const char *p;

	/* Handle the null filename case. */
	if (src == NULL || *src == '\0') {
		strcpy(dest, "GNUSparseFile/blank");
		return (dest);
	}

	/* Prune final '/' and other unwanted final elements. */
	p = src + strlen(src);
	for (;;) {
		/* Ends in "/", remove the '/' */
		if (p > src && p[-1] == '/') {
			--p;
			continue;
		}
		/* Ends in "/.", remove the '.' */
		if (p > src + 1 && p[-1] == '.'
		    && p[-2] == '/') {
			--p;
			continue;
		}
		break;
	}

	/* General case: build a ustar-compatible name adding
	 * "/GNUSparseFile/". */
	build_ustar_entry_name(dest, src, p - src, "GNUSparseFile.0");

	return (dest);
}